

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_tag.cpp
# Opt level: O0

char * ultag_getExtensionKey(ULanguageTag *langtag,int32_t idx)

{
  int local_2c;
  ExtensionListEntry *pEStack_28;
  int32_t i;
  ExtensionListEntry *cur;
  char *key;
  int32_t idx_local;
  ULanguageTag *langtag_local;
  
  pEStack_28 = langtag->extensions;
  local_2c = 0;
  while( true ) {
    if (pEStack_28 == (ExtensionListEntry *)0x0) {
      return (char *)0x0;
    }
    if (local_2c == idx) break;
    pEStack_28 = pEStack_28->next;
    local_2c = local_2c + 1;
  }
  return pEStack_28->key;
}

Assistant:

static const char*
ultag_getExtensionKey(const ULanguageTag* langtag, int32_t idx) {
    const char *key = NULL;
    ExtensionListEntry *cur = langtag->extensions;
    int32_t i = 0;
    while (cur) {
        if (i == idx) {
            key = cur->key;
            break;
        }
        cur = cur->next;
        i++;
    }
    return key;
}